

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  djg_clock *__ptr [1];
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined8 *puVar4;
  undefined7 extraout_var_03;
  
  __ptr[0] = g_gl.clocks[0];
  if (g_gl.clocks[0] != (djg_clock *)0x0) {
    (*glad_glDeleteQueries)(2,g_gl.clocks[0]->queries);
    free(__ptr[0]);
  }
  g_gl.clocks[0] = djgc_create();
  bVar1 = loadTextures();
  iVar3 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    bVar1 = loadBuffers();
    iVar3 = (int)CONCAT71(extraout_var_00,bVar1);
  }
  if ((char)iVar3 != '\0') {
    bVar1 = loadBackFramebuffer();
    bVar2 = loadSceneFramebuffer();
    iVar3 = (int)CONCAT71(extraout_var_01,bVar2 && bVar1);
  }
  if ((char)iVar3 != '\0') {
    bVar1 = loadVertexArrays();
    iVar3 = (int)CONCAT71(extraout_var_02,bVar1);
  }
  if ((char)iVar3 != '\0') {
    bVar1 = loadPrograms();
    iVar3 = (int)CONCAT71(extraout_var_03,bVar1);
  }
  if ((char)iVar3 != '\0') {
    return iVar3;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = std::__cxx11::string::operator=;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void init()
{
    bool v = true;
    int i;

    for (i = 0; i < CLOCK_COUNT; ++i) {
        if (g_gl.clocks[i])
            djgc_release(g_gl.clocks[i]);
        g_gl.clocks[i] = djgc_create();
    }

    if (v) v&= loadTextures();
    if (v) v&= loadBuffers();
    if (v) v&= loadFramebuffers();
    if (v) v&= loadVertexArrays();
    if (v) v&= loadPrograms();

    if (!v) throw std::exception();
}